

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

void __thiscall icu_63::ReorderingBuffer::removeSuffix(ReorderingBuffer *this,int32_t suffixLength)

{
  int32_t iVar1;
  int32_t suffixLength_local;
  ReorderingBuffer *this_local;
  
  if ((long)suffixLength < (long)this->limit - (long)this->start >> 1) {
    this->limit = this->limit + -(long)suffixLength;
    this->remainingCapacity = suffixLength + this->remainingCapacity;
  }
  else {
    this->limit = this->start;
    iVar1 = UnicodeString::getCapacity(this->str);
    this->remainingCapacity = iVar1;
  }
  this->lastCC = '\0';
  this->reorderStart = this->limit;
  return;
}

Assistant:

void ReorderingBuffer::removeSuffix(int32_t suffixLength) {
    if(suffixLength<(limit-start)) {
        limit-=suffixLength;
        remainingCapacity+=suffixLength;
    } else {
        limit=start;
        remainingCapacity=str.getCapacity();
    }
    lastCC=0;
    reorderStart=limit;
}